

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::reallocate
          (array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute> *this,u32 new_size)

{
  SAttribute *pSVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  SAttribute *pSVar7;
  ulong uVar8;
  u32 local_7c;
  SAttribute *local_68;
  int local_34;
  s32 i;
  s32 end;
  SAttribute *old_data;
  u32 new_size_local;
  array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute> *this_local;
  
  pSVar1 = this->data;
  uVar4 = CONCAT44(0,new_size);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar4;
  uVar5 = SUB168(auVar3 * ZEXT816(0x20),0);
  uVar8 = uVar5 + 8;
  if (SUB168(auVar3 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar5) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar8);
  *puVar6 = uVar4;
  pSVar7 = (SAttribute *)(puVar6 + 1);
  if (uVar4 != 0) {
    local_68 = pSVar7;
    do {
      irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute::SAttribute(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != pSVar7 + uVar4);
  }
  this->data = pSVar7;
  this->allocated = new_size;
  local_7c = new_size;
  if (this->used < new_size) {
    local_7c = this->used;
  }
  for (local_34 = 0; local_34 < (int)local_7c; local_34 = local_34 + 1) {
    irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute::operator=
              (this->data + local_34,pSVar1 + local_34);
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (pSVar1 != (SAttribute *)0x0) {
    lVar2 = *(long *)&pSVar1[-1].Value.allocated;
    pSVar7 = pSVar1 + lVar2;
    while (pSVar1 != pSVar7) {
      pSVar7 = pSVar7 + -1;
      irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute::~SAttribute(pSVar7);
    }
    operator_delete__(&pSVar1[-1].Value.allocated,lVar2 * 0x20 + 8);
  }
  return;
}

Assistant:

void reallocate(u32 new_size)
	{
		T* old_data = data;

		data = new T[new_size];
		allocated = new_size;
		
		s32 end = used < new_size ? used : new_size;
		for (s32 i=0; i<end; ++i)
			data[i] = old_data[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_data;
	}